

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_CutDsdBalanceEval_rec
              (If_DsdMan_t *p,int Id,int *pTimes,int *pnSupp,Vec_Int_t *vAig,int *piLit,int nSuppAll
              ,int *pArea,char *pPermLits)

{
  char cVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int t;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  uint *puVar9;
  ulong uVar10;
  uint fXor;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int pCounter [15];
  int pFaninLits [15];
  
  if ((Id < 0) || ((p->vObjs).nSize <= Id)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar2 = (int *)(p->vObjs).pArray[(uint)Id];
  uVar6 = piVar2[1];
  switch(uVar6 & 7) {
  case 2:
    iVar4 = *pnSupp;
    cVar1 = pPermLits[iVar4];
    if (cVar1 < '\0') {
LAB_00393daf:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      *piLit = (int)cVar1;
      iVar4 = *pnSupp;
    }
    *pnSupp = iVar4 + 1;
    iVar4 = pTimes[(uint)(int)cVar1 >> 1];
    break;
  case 3:
  case 4:
    if (0x7ffffff < uVar6) {
      fXor = (uint)((uVar6 & 7) == 4);
      uVar12 = piVar2[2];
      if (uVar12 == 0) {
        uVar6 = uVar6 >> 0x1b;
        iVar4 = 0;
        uVar11 = 0;
      }
      else {
        uVar14 = 0;
        uVar16 = 0;
        do {
          if ((int)uVar12 < 0) goto LAB_00393daf;
          puVar9 = (uint *)(pFaninLits + uVar16);
          iVar4 = If_CutDsdBalanceEval_rec
                            (p,uVar12 >> 1,pTimes,pnSupp,vAig,(int *)puVar9,nSuppAll,pArea,pPermLits
                            );
          if (iVar4 == -1) {
            return -1;
          }
          iVar5 = (int)uVar14;
          if (vAig == (Vec_Int_t *)0x0) {
            uVar11 = iVar5 + 1;
            pCounter[iVar5] = iVar4;
            if (0 < iVar5) {
              do {
                iVar4 = pCounter[uVar14];
                iVar13 = (int)uVar14;
                uVar10 = (ulong)(iVar13 - 1);
                iVar5 = pCounter[uVar10];
                if (iVar4 < iVar5) break;
                if (iVar5 < iVar4) {
                  pCounter[uVar14] = iVar5;
                  pCounter[uVar10] = iVar4;
                }
                else {
                  pCounter[uVar10] = iVar5 + 1;
                  uVar11 = uVar11 - 1;
                  if (iVar13 < (int)uVar11) {
                    piVar7 = pCounter + uVar14 + 1;
                    do {
                      piVar7[-1] = *piVar7;
                      piVar7 = piVar7 + 1;
                      uVar6 = (int)uVar14 + 1;
                      uVar14 = (ulong)uVar6;
                    } while ((int)uVar6 < (int)uVar11);
                  }
                }
                uVar14 = uVar10;
              } while (1 < iVar13);
            }
          }
          else {
            if ((int)*puVar9 < 0) {
LAB_00393dce:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10f,"int Abc_LitNotCond(int, int)");
            }
            uVar6 = *puVar9 ^ uVar12 & 1;
            *puVar9 = uVar6;
            pFaninLits[iVar5] = uVar6;
            uVar11 = iVar5 + 1;
            pCounter[iVar5] = iVar4;
            if (0 < iVar5) {
              do {
                uVar10 = uVar14 & 0xffffffff;
                iVar4 = pCounter[uVar10];
                uVar15 = uVar14 - 1 & 0xffffffff;
                iVar5 = pCounter[uVar15];
                if (iVar4 < iVar5) break;
                iVar13 = (int)uVar14;
                if (iVar5 < iVar4) {
                  pCounter[uVar10] = iVar5;
                  pCounter[uVar15] = iVar4;
                  iVar4 = pFaninLits[uVar10];
                  pFaninLits[uVar10] = pFaninLits[uVar15];
                  pFaninLits[uVar15] = iVar4;
                }
                else {
                  pCounter[uVar15] = iVar5 + 1;
                  iVar4 = If_LogCreateAndXor(vAig,pFaninLits[uVar10],pFaninLits[uVar15],nSuppAll,
                                             fXor);
                  pFaninLits[uVar15] = iVar4;
                  uVar11 = uVar11 - 1;
                  if (iVar13 < (int)uVar11) {
                    lVar8 = 0;
                    do {
                      pCounter[uVar10 + lVar8] = pCounter[uVar10 + lVar8 + 1];
                      pFaninLits[uVar10 + lVar8] = pFaninLits[uVar10 + lVar8 + 1];
                      lVar8 = lVar8 + 1;
                    } while ((int)lVar8 + iVar13 < (int)uVar11);
                  }
                }
                uVar14 = uVar14 - 1;
              } while (1 < iVar13);
            }
          }
          if ((int)uVar11 < 1) {
            __assert_fail("nTimes > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                          ,0x77,
                          "int If_LogCounterAddAig(int *, int *, int *, int, int, Vec_Int_t *, int, int, int)"
                         );
          }
          uVar14 = (ulong)uVar11;
          uVar6 = (uint)piVar2[1] >> 0x1b;
          if ((ulong)uVar6 <= uVar16 + 1) {
            iVar4 = pCounter[0] + (uint)(uVar11 != 1);
            goto LAB_00393d17;
          }
          uVar12 = piVar2[uVar16 + 3];
          uVar16 = uVar16 + 1;
        } while (uVar12 != 0);
        iVar4 = pCounter[0] + (uint)(uVar11 != 1);
      }
      if (uVar11 != 0) {
LAB_00393d17:
        if (vAig == (Vec_Int_t *)0x0) {
          *pArea = uVar6 + *pArea + -1;
          return iVar4;
        }
        if (uVar11 != 1) {
          uVar14 = (ulong)uVar11 + 1;
          do {
            iVar5 = If_LogCreateAndXor(vAig,pCounter[uVar14 + 0xe],pCounter[uVar14 + 0xd],nSuppAll,
                                       fXor);
            pCounter[uVar14 + 0xd] = iVar5;
            uVar14 = uVar14 - 1;
          } while (2 < uVar14);
        }
        *piLit = pFaninLits[0];
        return iVar4;
      }
    }
    __assert_fail("nCounter > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                  ,0x8fa,
                  "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                 );
  case 5:
    if (0x7ffffff < uVar6) {
      piVar7 = pCounter;
      puVar9 = (uint *)pFaninLits;
      uVar14 = 0;
      do {
        uVar6 = piVar2[uVar14 + 2];
        if (uVar6 == 0) break;
        if ((int)uVar6 < 0) goto LAB_00393daf;
        iVar4 = If_CutDsdBalanceEval_rec
                          (p,uVar6 >> 1,pTimes,pnSupp,vAig,(int *)puVar9,nSuppAll,pArea,pPermLits);
        *piVar7 = iVar4;
        if (iVar4 == -1) {
          return -1;
        }
        if (vAig != (Vec_Int_t *)0x0) {
          if ((int)*puVar9 < 0) goto LAB_00393dce;
          *puVar9 = *puVar9 ^ uVar6 & 1;
        }
        uVar14 = uVar14 + 1;
        piVar7 = piVar7 + 1;
        puVar9 = puVar9 + 1;
      } while (uVar14 < (uint)piVar2[1] >> 0x1b);
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *pArea = *pArea + 3;
    }
    else {
      iVar4 = If_LogCreateMux(vAig,pFaninLits[0],pFaninLits[1],pFaninLits[2],nSuppAll);
      *piLit = iVar4;
    }
    if (pCounter[2] < pCounter[1]) {
      pCounter[2] = pCounter[1];
    }
    if (pCounter[2] < pCounter[0]) {
      pCounter[2] = pCounter[0];
    }
    iVar4 = pCounter[2] + 2;
    break;
  case 6:
    if (0x17ffffff < uVar6) {
      iVar4 = *piVar2;
      if (((long)iVar4 < 0) || ((p->vTruths).nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = (p->vTruths).pArray[iVar4];
      lVar8 = (long)iVar4;
      if ((-1 < lVar8) && (iVar4 < p->vIsops[uVar6 >> 0x1b]->nSize)) {
        pVVar3 = p->vIsops[uVar6 >> 0x1b]->pArray;
        if (pVVar3[lVar8].nSize == 0) {
          return -1;
        }
        lVar17 = 0;
        uVar14 = 0;
        do {
          uVar6 = *(uint *)((long)piVar2 + lVar17 + 8);
          if (uVar6 == 0) break;
          if ((int)uVar6 < 0) goto LAB_00393daf;
          puVar9 = (uint *)((long)pFaninLits + lVar17);
          iVar4 = If_CutDsdBalanceEval_rec
                            (p,uVar6 >> 1,pTimes,pnSupp,vAig,(int *)puVar9,nSuppAll,pArea,pPermLits)
          ;
          *(int *)((long)pCounter + lVar17) = iVar4;
          if (iVar4 == -1) {
            return -1;
          }
          if (vAig != (Vec_Int_t *)0x0) {
            if ((int)*puVar9 < 0) goto LAB_00393dce;
            *puVar9 = *puVar9 ^ uVar6 & 1;
          }
          uVar14 = uVar14 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar14 < (uint)piVar2[1] >> 0x1b);
        iVar4 = If_CutSopBalanceEvalInt
                          (pVVar3 + lVar8,pCounter,pFaninLits,vAig,piLit,nSuppAll,pArea);
        return iVar4;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  default:
    __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                  ,0x8eb,
                  "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                 );
  }
  return iVar4;
}

Assistant:

int If_CutDsdBalanceEval_rec( If_DsdMan_t * p, int Id, int * pTimes, int * pnSupp, Vec_Int_t * vAig, int * piLit, int nSuppAll, int * pArea, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var( pPermLits[*pnSupp] );
        if ( vAig ) 
            *piLit = Abc_Var2Lit( iCutVar, Abc_LitIsCompl(pPermLits[*pnSupp]) );
        (*pnSupp)++;
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        int i, iFanin, Delays[3], pFaninLits[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        if ( vAig )
            *piLit = If_LogCreateMux( vAig, pFaninLits[0], pFaninLits[1], pFaninLits[2], nSuppAll );
        else
            *pArea += 3;
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        if ( Vec_IntSize(vCover) == 0 )
            return -1;
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        return If_CutSopBalanceEvalInt( vCover, Delays, pFaninLits, vAig, piLit, nSuppAll, pArea );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int fXorFunc = (If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delay == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
            Result = If_LogCounterAddAig( pCounter, &nCounter, pFaninLits, Delay, vAig ? pFaninLits[i] : -1, vAig, nSuppAll, fXor, fXorFunc );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        if ( vAig )
            *piLit = If_LogCreateAndXorMulti( vAig, pFaninLits, nCounter, nSuppAll, fXorFunc );
        else
            *pArea += (pObj->nFans - 1) * (1 + 2 * fXor);
        return Result;
    }
}